

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugins.h
# Opt level: O1

void __thiscall
f8n::plugin::Plugins::QueryFunction<void(*)(f8n::sdk::IPreferences*)>
          (Plugins *this,string *functionName,
          function<void_(f8n::sdk::IPlugin_*,_void_(*)(f8n::sdk::IPreferences_*))> *handler)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  int iVar4;
  _func_void_IPreferences_ptr *p_Var5;
  undefined8 uVar6;
  pointer psVar7;
  unique_lock<std::mutex> lock;
  _func_void_IPreferences_ptr *local_50;
  IPlugin *local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  psVar7 = (this->plugins).
           super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->plugins).
           super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar7 == psVar1) {
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return;
    }
    peVar2 = (psVar7->
             super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    this_00 = (psVar7->
              super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    peVar3 = (this->prefs).super___shared_ptr<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar4 = (*peVar3->_vptr_IPreferences[1])(peVar3,(peVar2->key)._M_dataplus._M_p,1);
    if ((char)iVar4 != '\0') {
      p_Var5 = (_func_void_IPreferences_ptr *)
               dlsym(peVar2->nativeHandle,(functionName->_M_dataplus)._M_p);
      if (p_Var5 != (_func_void_IPreferences_ptr *)0x0) {
        local_48 = peVar2->plugin;
        local_50 = p_Var5;
        if ((handler->super__Function_base)._M_manager == (_Manager_type)0x0) {
          uVar6 = std::__throw_bad_function_call();
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          std::unique_lock<std::mutex>::~unique_lock(&local_40);
          _Unwind_Resume(uVar6);
        }
        (*handler->_M_invoker)((_Any_data *)handler,&local_48,&local_50);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    psVar7 = psVar7 + 1;
  } while( true );
}

Assistant:

void QueryFunction(
                const std::string& functionName,
                std::function<void(f8n::sdk::IPlugin*, T)> handler)
            {
                std::unique_lock<std::mutex> lock(this->mutex);

                for (std::shared_ptr<Descriptor> descriptor : this->plugins) {
                    if (prefs->GetBool(descriptor->key.c_str(), true)) { /* if enabled by prefs */
                        T funcPtr =
#ifdef WIN32
                            (T) GetProcAddress((HMODULE)(descriptor->nativeHandle), functionName.c_str());
#else
                            (T)dlsym(descriptor->nativeHandle, functionName.c_str());
#endif
                        if (funcPtr) {
                            handler(descriptor->plugin, funcPtr);
                        }
                    }
                }
            }